

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode do_init_stack(Curl_easy *data)

{
  Curl_cwriter *writer_00;
  CURLcode CVar1;
  CURLcode CVar2;
  Curl_cwriter *in_RAX;
  Curl_cwriter *writer;
  
  writer = in_RAX;
  CVar1 = Curl_cwriter_create(&(data->req).writer_stack,data,&cw_client,CURL_CW_CLIENT);
  if ((CVar1 == CURLE_OK) &&
     (CVar1 = Curl_cwriter_create(&writer,data,&cw_download,CURL_CW_PROTOCOL), writer_00 = writer,
     CVar1 == CURLE_OK)) {
    CVar1 = Curl_cwriter_add(data,writer);
    if (CVar1 != CURLE_OK) {
      Curl_cwriter_free(data,writer_00);
    }
    CVar1 = Curl_cwriter_create(&writer,data,&cw_raw,CURL_CW_RAW);
    if ((CVar1 == CURLE_OK) &&
       (CVar2 = Curl_cwriter_add(data,writer), CVar1 = CURLE_OK, CVar2 != CURLE_OK)) {
      Curl_cwriter_free(data,writer);
      CVar1 = CVar2;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode do_init_stack(struct Curl_easy *data)
{
  struct Curl_cwriter *writer;
  CURLcode result;

  DEBUGASSERT(!data->req.writer_stack);
  result = Curl_cwriter_create(&data->req.writer_stack,
                               data, &cw_client, CURL_CW_CLIENT);
  if(result)
    return result;

  result = Curl_cwriter_create(&writer, data, &cw_download, CURL_CW_PROTOCOL);
  if(result)
    return result;
  result = Curl_cwriter_add(data, writer);
  if(result) {
    Curl_cwriter_free(data, writer);
  }

  result = Curl_cwriter_create(&writer, data, &cw_raw, CURL_CW_RAW);
  if(result)
    return result;
  result = Curl_cwriter_add(data, writer);
  if(result) {
    Curl_cwriter_free(data, writer);
  }
  return result;
}